

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

stsentry * Curl_hsts(hsts *h,char *hostname,_Bool subdomain)

{
  int iVar1;
  time_t tVar2;
  stsentry *max;
  size_t offs;
  size_t ntail;
  stsentry *sts;
  size_t blen;
  Curl_llist_node *n;
  Curl_llist_node *e;
  size_t hlen;
  time_t now;
  stsentry *bestsub;
  _Bool subdomain_local;
  char *hostname_local;
  hsts *h_local;
  
  now = 0;
  if (h == (hsts *)0x0) {
LAB_00149777:
    h_local = (hsts *)now;
  }
  else {
    tVar2 = time((time_t *)0x0);
    e = (Curl_llist_node *)strlen(hostname);
    sts = (stsentry *)0x0;
    if ((e < (Curl_llist_node *)0x101) && (e != (Curl_llist_node *)0x0)) {
      if (hostname[(long)((long)&e[-1]._next + 7)] == '.') {
        e = (Curl_llist_node *)((long)&e[-1]._next + 7);
      }
      n = Curl_llist_head(&h->list);
      do {
        while( true ) {
          if (n == (Curl_llist_node *)0x0) goto LAB_00149777;
          h_local = (hsts *)Curl_node_elem(n);
          n = Curl_node_next(n);
          if (tVar2 < ((stsentry *)h_local)->expires) break;
          Curl_node_remove((Curl_llist_node *)h_local);
          hsts_free((stsentry *)h_local);
        }
        max = (stsentry *)strlen(((stsentry *)h_local)->host);
        if (((((subdomain) && ((((stsentry *)h_local)->includeSubDomains & 1U) != 0)) && (max < e))
            && ((hostname[((long)e - (long)max) + -1] == '.' &&
                (iVar1 = curl_strnequal(hostname + ((long)e - (long)max),((stsentry *)h_local)->host
                                        ,(size_t)max), iVar1 != 0)))) && (sts < max)) {
          sts = max;
          now = (time_t)h_local;
        }
      } while (((stsentry *)e != max) ||
              (iVar1 = curl_strnequal(hostname,((stsentry *)h_local)->host,(size_t)e), iVar1 == 0));
    }
    else {
      h_local = (hsts *)0x0;
    }
  }
  return (stsentry *)h_local;
}

Assistant:

struct stsentry *Curl_hsts(struct hsts *h, const char *hostname,
                           bool subdomain)
{
  struct stsentry *bestsub = NULL;
  if(h) {
    time_t now = time(NULL);
    size_t hlen = strlen(hostname);
    struct Curl_llist_node *e;
    struct Curl_llist_node *n;
    size_t blen = 0;

    if((hlen > MAX_HSTS_HOSTLEN) || !hlen)
      return NULL;
    if(hostname[hlen-1] == '.')
      /* remove the trailing dot */
      --hlen;

    for(e = Curl_llist_head(&h->list); e; e = n) {
      struct stsentry *sts = Curl_node_elem(e);
      size_t ntail;
      n = Curl_node_next(e);
      if(sts->expires <= now) {
        /* remove expired entries */
        Curl_node_remove(&sts->node);
        hsts_free(sts);
        continue;
      }
      ntail = strlen(sts->host);
      if((subdomain && sts->includeSubDomains) && (ntail < hlen)) {
        size_t offs = hlen - ntail;
        if((hostname[offs-1] == '.') &&
           strncasecompare(&hostname[offs], sts->host, ntail) &&
           (ntail > blen)) {
          /* save the tail match with the longest tail */
          bestsub = sts;
          blen = ntail;
        }
      }
      /* avoid strcasecompare because the host name is not null terminated */
      if((hlen == ntail) && strncasecompare(hostname, sts->host, hlen))
        return sts;
    }
  }
  return bestsub;
}